

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaggageTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::baggage::anon_unknown_3::TestStatsReporter::incCounter
          (TestStatsReporter *this,string *name,int64_t delta,TagMap *tags)

{
  mapped_type *pmVar1;
  mapped_type *currentValue;
  undefined1 local_50 [8];
  string metricName;
  lock_guard<std::mutex> lock;
  TagMap *tags_local;
  int64_t delta_local;
  string *name_local;
  TestStatsReporter *this_local;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)((long)&metricName.field_2 + 8),&this->_mutex);
  jaegertracing::metrics::Metrics::addTagsToMetricName((string *)local_50,(unordered_map *)name);
  pmVar1 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::operator[](&this->_counters,(key_type *)local_50);
  *pmVar1 = *pmVar1 + delta;
  std::__cxx11::string::~string((string *)local_50);
  std::lock_guard<std::mutex>::~lock_guard
            ((lock_guard<std::mutex> *)((long)&metricName.field_2 + 8));
  return;
}

Assistant:

void incCounter(const std::string& name,
                    int64_t delta,
                    const metrics::StatsReporter::TagMap& tags) override
    {
        std::lock_guard<std::mutex> lock(_mutex);

        const auto metricName =
            metrics::Metrics::addTagsToMetricName(name, tags);
        auto& currentValue = _counters[metricName];
        currentValue = currentValue + delta;
    }